

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  pointer puVar2;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var3;
  size_t __n;
  cmake *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmValue cVar7;
  string *psVar8;
  string *psVar9;
  char *extraout_RDX;
  pointer puVar10;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string e;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  pointer local_48;
  _Alloc_hider local_40;
  cmGlobalGenerator *local_38;
  
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"C","");
  bVar4 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_b8);
  if (bVar4) {
    bVar4 = false;
  }
  else {
    local_68._0_8_ = (_Base_ptr)(local_68 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"CXX","");
    bVar4 = cmState::GetLanguageEnabled
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_68);
    if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    bVar4 = !bVar4;
  }
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if (!bVar4) {
    local_40._M_p =
         (pointer)(this->LocalGenerators).
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((pointer)local_40._M_p != local_48) {
      bVar4 = false;
      local_38 = this;
      do {
        pcVar1 = (((pointer)local_40._M_p)->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        puVar2 = *(pointer *)
                  ((long)&(pcVar1->GeneratorTargets).
                          super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  + 8);
        for (puVar10 = *(pointer *)
                        &(pcVar1->GeneratorTargets).
                         super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                         ._M_impl; puVar10 != puVar2; puVar10 = puVar10 + 1) {
          bVar5 = cmGeneratorTarget::CanCompileSources
                            ((cmGeneratorTarget *)
                             (puVar10->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
          if (bVar5) {
            _Var3.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar10->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            local_b8._0_8_ = local_b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"ghs_integrity_app","");
            cVar7 = cmGeneratorTarget::GetProperty
                              ((cmGeneratorTarget *)
                               _Var3.
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                               (string *)local_b8);
            if (cVar7.Value == (string *)0x0) {
              bVar5 = false;
            }
            else {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p;
              bVar5 = cmValue::IsOn((cmValue *)(cVar7.Value)->_M_string_length,value);
            }
            if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
            if (bVar5 == false) {
              _Var3.
              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
              .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (puVar10->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              local_b8._0_8_ = local_b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b8,"PRECOMPILE_HEADERS_REUSE_FROM","");
              psVar8 = cmGeneratorTarget::GetSafeProperty
                                 ((cmGeneratorTarget *)
                                  _Var3.
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                                  (string *)local_b8);
              if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
                operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
              }
              _Var3.
              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
              .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (puVar10->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              local_b8._0_8_ = local_b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b8,"COMPILE_PDB_NAME","");
              psVar9 = cmGeneratorTarget::GetSafeProperty
                                 ((cmGeneratorTarget *)
                                  _Var3.
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                                  (string *)local_b8);
              if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
                operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
              }
              __n = psVar8->_M_string_length;
              if ((__n != 0) &&
                 ((__n != psVar9->_M_string_length ||
                  (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p,__n),
                  iVar6 != 0)))) {
                psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                                   ((cmGeneratorTarget *)
                                    (puVar10->_M_t).
                                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   );
                local_b8._24_8_ = (psVar9->_M_dataplus)._M_p;
                local_b8._16_8_ = psVar9->_M_string_length;
                local_b8._0_8_ = (pointer)0x3a;
                local_b8._8_8_ = "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"";
                local_98._M_p = (pointer)0x5a;
                local_90 = 
                "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
                ;
                local_88._8_8_ = (psVar8->_M_dataplus)._M_p;
                local_88._M_allocated_capacity = psVar8->_M_string_length;
                local_78._0_8_ = 2;
                local_78._8_8_ = "\"\n";
                views._M_len = 5;
                views._M_array = (iterator)local_b8;
                cmCatViews_abi_cxx11_((string *)local_68,views);
                this_00 = local_38->CMakeInstance;
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_b8);
                cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_68,
                                    (cmListFileBacktrace *)local_b8);
                if ((cmMakefile *)local_b8._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
                }
                if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)(local_68 + 0x10)) {
                  operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
                }
                bVar4 = true;
              }
            }
          }
        }
        local_40._M_p = local_40._M_p + 8;
      } while ((pointer)local_40._M_p != local_48);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          cmIsOn(target->GetProperty("ghs_integrity_app"))) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}